

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenInitializer::AddToSourceGroup
          (cmQtAutoGenInitializer *this,string *fileName,string_view genNameUpper)

{
  cmState *this_00;
  cmValue cVar1;
  cmSourceGroup *this_01;
  char *pcVar2;
  long lVar3;
  string_view text;
  string groupName;
  string local_110;
  string property;
  cmAlphaNum local_d0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  property._M_dataplus._M_p = (pointer)&property.field_2;
  property._M_string_length = 0;
  pcVar2 = (char *)0x0;
  property.field_2._M_local_buf[0] = '\0';
  groupName._M_dataplus._M_p = (pointer)&groupName.field_2;
  groupName._M_string_length = 0;
  groupName.field_2._M_local_buf[0] = '\0';
  local_90.View_._M_len = 0xd;
  local_90.View_._M_str = "_SOURCE_GROUP";
  local_60.View_._M_len = genNameUpper._M_len;
  local_60.View_._M_str = genNameUpper._M_str;
  cmStrCat<>((string *)&local_d0,&local_60,&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_d0.Digits_ + 0x10),"AUTOGEN_SOURCE_GROUP",
             (allocator<char> *)&local_110);
  for (lVar3 = 0; lVar3 != 0x40; lVar3 = lVar3 + 0x20) {
    this_00 = cmMakefile::GetState(this->Makefile);
    cVar1 = cmState::GetGlobalProperty(this_00,(string *)(local_d0.Digits_ + lVar3 + -0x10));
    if ((cVar1.Value != (string *)0x0) && ((cVar1.Value)->_M_string_length != 0)) {
      std::__cxx11::string::_M_assign((string *)&groupName);
      std::__cxx11::string::_M_assign((string *)&property);
      break;
    }
  }
  lVar3 = 0x20;
  do {
    std::__cxx11::string::~string((string *)(local_d0.Digits_ + lVar3 + -0x10));
    lVar3 = lVar3 + -0x20;
  } while (lVar3 != -0x20);
  if (groupName._M_string_length != 0) {
    this_01 = cmMakefile::GetOrCreateSourceGroup(this->Makefile,&groupName);
    if (this_01 != (cmSourceGroup *)0x0) goto LAB_003d59bf;
    local_60.View_._M_len = 10;
    local_60.View_._M_str = " error in ";
    text._M_str = pcVar2;
    text._M_len = (size_t)groupName._M_dataplus._M_p;
    local_d0.View_._M_len = genNameUpper._M_len;
    local_d0.View_._M_str = genNameUpper._M_str;
    cmQtAutoGen::Quoted_abi_cxx11_(&local_110,(cmQtAutoGen *)groupName._M_string_length,text);
    cmStrCat<std::__cxx11::string,char[45],std::__cxx11::string>
              ((string *)&local_90,&local_d0,&local_60,&property,
               (char (*) [45])": Could not find or create the source group ",&local_110);
    cmSystemTools::Error((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_110);
  }
  this_01 = (cmSourceGroup *)0x0;
LAB_003d59bf:
  std::__cxx11::string::~string((string *)&groupName);
  std::__cxx11::string::~string((string *)&property);
  if (this_01 != (cmSourceGroup *)0x0) {
    cmSourceGroup::AddGroupFile(this_01,fileName);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::AddToSourceGroup(std::string const& fileName,
                                              cm::string_view genNameUpper)
{
  cmSourceGroup* sourceGroup = nullptr;
  // Acquire source group
  {
    std::string property;
    std::string groupName;
    {
      // Prefer generator specific source group name
      std::initializer_list<std::string> const props{
        cmStrCat(genNameUpper, "_SOURCE_GROUP"), "AUTOGEN_SOURCE_GROUP"
      };
      for (std::string const& prop : props) {
        cmValue propName = this->Makefile->GetState()->GetGlobalProperty(prop);
        if (cmNonempty(propName)) {
          groupName = *propName;
          property = prop;
          break;
        }
      }
    }
    // Generate a source group on demand
    if (!groupName.empty()) {
      sourceGroup = this->Makefile->GetOrCreateSourceGroup(groupName);
      if (!sourceGroup) {
        cmSystemTools::Error(
          cmStrCat(genNameUpper, " error in ", property,
                   ": Could not find or create the source group ",
                   cmQtAutoGen::Quoted(groupName)));
      }
    }
  }
  if (sourceGroup) {
    sourceGroup->AddGroupFile(fileName);
  }
}